

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O2

mt19937_64 * phmap::priv::hash_internal::GetSharedRng(void)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  mt19937_64 *pmVar4;
  size_t __i;
  unsigned_long uVar5;
  long lVar6;
  uint_least32_t __arr [624];
  RandomDeviceSeedSeq seed_seq;
  unsigned_long local_1d68 [313];
  random_device local_13a0;
  
  std::random_device::random_device(&local_13a0);
  if ((GetSharedRng()::rng == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetSharedRng()::rng), iVar2 != 0)) {
    pmVar4 = (mt19937_64 *)operator_new(0x9c8);
    for (lVar6 = 0; lVar6 != 0x9c0; lVar6 = lVar6 + 4) {
      uVar3 = std::random_device::_M_getval();
      *(undefined4 *)((long)local_1d68 + lVar6) = uVar3;
    }
    bVar1 = true;
    for (lVar6 = 0; lVar6 != 0x138; lVar6 = lVar6 + 1) {
      uVar5 = local_1d68[lVar6];
      pmVar4->_M_x[lVar6] = uVar5;
      if (bVar1) {
        if (lVar6 == 0) {
          uVar5 = pmVar4->_M_x[0] >> 0x1f;
        }
        if (uVar5 != 0) {
          bVar1 = false;
        }
      }
    }
    if (bVar1) {
      pmVar4->_M_x[0] = 0x8000000000000000;
    }
    pmVar4->_M_p = 0x138;
    GetSharedRng::rng = pmVar4;
    __cxa_guard_release(&GetSharedRng()::rng);
  }
  pmVar4 = GetSharedRng::rng;
  std::random_device::~random_device(&local_13a0);
  return pmVar4;
}

Assistant:

std::mt19937_64* GetSharedRng() {
    RandomDeviceSeedSeq seed_seq;
    static auto* rng = new std::mt19937_64(seed_seq);
    return rng;
}